

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> __thiscall
Assimp::FIReader::create(FIReader *this,IOStream *stream)

{
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar1;
  int iVar2;
  undefined4 extraout_var;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> data_00;
  undefined4 extraout_var_00;
  size_t sVar3;
  CFIReaderImpl *this_00;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_01;
  _func_int **pp_Var4;
  IrrXMLReader *pIVar5;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> data;
  _Head_base<0UL,_unsigned_char_*,_false> local_28;
  
  iVar2 = (*stream->_vptr_IOStream[6])(stream);
  pp_Var4 = (_func_int **)CONCAT44(extraout_var,iVar2);
  data_00._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__((ulong)pp_Var4)
  ;
  data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       data_00._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  iVar2 = (*stream->_vptr_IOStream[2])
                    (stream,data_00._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,pp_Var4,1);
  if (CONCAT44(extraout_var_00,iVar2) != 1) {
    pp_Var4 = (_func_int **)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&data,
               (pointer)0x0);
    data_00._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)data;
  }
  sVar3 = parseMagic((uint8_t *)
                     data_00._M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                     (uint8_t *)
                     ((long)data_00._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                     (long)pp_Var4));
  if (sVar3 == 0) {
    _stream = (IOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    uVar1 = data;
    data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
    _stream->_vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0071b5c0;
    _stream[1]._vptr_IOStream =
         (_func_int **)
         uVar1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
         .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    _stream[2]._vptr_IOStream = pp_Var4;
    _stream[3]._vptr_IOStream = (_func_int **)0x0;
    *(undefined1 *)&_stream[4]._vptr_IOStream = 1;
    this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,_stream);
    pp_Var4 = (_func_int **)operator_new(0x10);
    pIVar5 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_01);
    *pp_Var4 = (_func_int *)&PTR__CXMLReaderImpl_007e5e50;
    pp_Var4[1] = (_func_int *)pIVar5;
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = pp_Var4;
    (*(this_01->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_01);
    (*_stream->_vptr_IOStream[1])(_stream);
  }
  else {
    this_00 = (CFIReaderImpl *)operator_new(0x230);
    data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
    local_28._M_head_impl =
         (uchar *)data_00._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    CFIReaderImpl::CFIReaderImpl
              (this_00,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_28,(size_t)pp_Var4);
    (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader = (_func_int **)this_00
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_28);
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&data);
  return (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)
         (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)this;
}

Assistant:

std::unique_ptr<FIReader> FIReader::create(IOStream *stream)
{
    size_t size;
    bool isFI;
    auto data = readFile(stream, size, isFI);
    if (isFI) {
        return std::unique_ptr<FIReader>(new CFIReaderImpl(std::move(data), size));
    }
    else {
        auto memios = std::unique_ptr<MemoryIOStream>(new MemoryIOStream(data.release(), size, true));
        auto callback = std::unique_ptr<CIrrXML_IOStreamReader>(new CIrrXML_IOStreamReader(memios.get()));
        return std::unique_ptr<FIReader>(new CXMLReaderImpl(std::unique_ptr<irr::io::IIrrXMLReader<char, irr::io::IXMLBase>>(createIrrXMLReader(callback.get()))));
    }
}